

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O3

void __thiscall
olc::PixelGameEngine::DrawPartialDecal
          (PixelGameEngine *this,vf2d *pos,vf2d *size,Decal *decal,vf2d *source_pos,
          vf2d *source_size,Pixel *tint)

{
  float fVar1;
  float fVar2;
  value_type local_68;
  
  local_68.w[0] = 1.0;
  local_68.w[1] = 1.0;
  local_68.w[2] = 1.0;
  local_68.w[3] = 1.0;
  local_68.tint[1].field_0 = WHITE;
  local_68.tint[2].field_0 = WHITE;
  local_68.tint[3].field_0 = WHITE;
  local_68.tint[0].field_0.field_1 = tint->field_0;
  local_68.pos[3].x = (this->vInvScreenSize).x;
  fVar2 = (this->vInvScreenSize).y;
  fVar1 = pos->x * local_68.pos[3].x;
  local_68.pos[0].x = fVar1 + fVar1 + -1.0;
  local_68.pos[3].x = (*size).x * 2.0 * local_68.pos[3].x;
  local_68.pos[2].y = (*size).y * -2.0 * fVar2;
  fVar2 = fVar2 * pos->y;
  local_68.pos[0].y = -(fVar2 + fVar2 + -1.0);
  local_68.pos[1].y = local_68.pos[2].y + local_68.pos[0].y;
  local_68.pos[2].x = local_68.pos[3].x + local_68.pos[0].x;
  local_68.pos[2].y = local_68.pos[2].y + local_68.pos[0].y;
  local_68.pos[3].x = local_68.pos[3].x + local_68.pos[0].x;
  fVar1 = (decal->vUVScale).x;
  local_68.uv[0].x = (*source_pos).x * fVar1;
  fVar2 = (decal->vUVScale).y;
  local_68.uv[0].y = (*source_pos).y * fVar2;
  local_68.uv[2].x = (*source_size).x * fVar1 + local_68.uv[0].x;
  local_68.uv[1].y = (*source_size).y * fVar2 + local_68.uv[0].y;
  local_68.decal = decal;
  local_68.pos[1].x = local_68.pos[0].x;
  local_68.pos[3].y = local_68.pos[0].y;
  local_68.uv[1].x = local_68.uv[0].x;
  local_68.uv[2].y = local_68.uv[1].y;
  local_68.uv[3].x = local_68.uv[2].x;
  local_68.uv[3].y = local_68.uv[0].y;
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             &local_68);
  return;
}

Assistant:

void PixelGameEngine::DrawPartialDecal(const olc::vf2d& pos, const olc::vf2d& size, olc::Decal* decal, const olc::vf2d& source_pos, const olc::vf2d& source_size, const olc::Pixel& tint)
	{
		olc::vf2d vScreenSpacePos =
		{
			(pos.x * vInvScreenSize.x) * 2.0f - 1.0f,
			((pos.y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f
		};

		olc::vf2d vScreenSpaceDim =
		{
			vScreenSpacePos.x + (2.0f * size.x * vInvScreenSize.x),
			vScreenSpacePos.y - (2.0f * size.y * vInvScreenSize.y)
		};

		DecalInstance di; di.decal = decal;	di.tint[0] = tint;

		di.pos[0] = { vScreenSpacePos.x, vScreenSpacePos.y };
		di.pos[1] = { vScreenSpacePos.x, vScreenSpaceDim.y };
		di.pos[2] = { vScreenSpaceDim.x, vScreenSpaceDim.y };
		di.pos[3] = { vScreenSpaceDim.x, vScreenSpacePos.y };

		olc::vf2d uvtl = source_pos * decal->vUVScale;
		olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
		di.uv[0] = { uvtl.x, uvtl.y }; di.uv[1] = { uvtl.x, uvbr.y };
		di.uv[2] = { uvbr.x, uvbr.y }; di.uv[3] = { uvbr.x, uvtl.y };
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}